

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O0

void __thiscall
DynamicHeap<unsigned_int,_float,_std::less<float>,_std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>
::ascend(DynamicHeap<unsigned_int,_float,_std::less<float>,_std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>
         *this,uint i)

{
  bool bVar1;
  mapped_type *pmVar2;
  uint in_ESI;
  DynamicHeap<unsigned_int,_float,_std::less<float>,_std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>
  *in_RDI;
  DynamicHeap<unsigned_int,_float,_std::less<float>,_std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>
  *unaff_retaddr;
  uint j;
  undefined1 local_19;
  uint in_stack_fffffffffffffff0;
  DynamicHeap<unsigned_int,_float,_std::less<float>,_std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>
  *pDVar3;
  
  pDVar3 = in_RDI;
  while( true ) {
    local_19 = 0;
    if (in_ESI != 0) {
      in_stack_fffffffffffffff0 = parent(in_RDI,in_ESI);
      bVar1 = ordered((DynamicHeap<unsigned_int,_float,_std::less<float>,_std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>
                       *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(uint)((ulong)in_RDI >> 0x20),
                      (uint)in_RDI);
      local_19 = bVar1 ^ 0xff;
    }
    if ((local_19 & 1) == 0) break;
    swap(unaff_retaddr,(uint)((ulong)pDVar3 >> 0x20),(uint)pDVar3);
    in_ESI = in_stack_fffffffffffffff0;
  }
  std::
  vector<DynamicHeap<unsigned_int,_float,_std::less<float>,_std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>::HeapEntry,_std::allocator<DynamicHeap<unsigned_int,_float,_std::less<float>,_std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>::HeapEntry>_>
  ::operator[](&in_RDI->heap,(ulong)in_ESI);
  pmVar2 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                         *)this,(key_type *)CONCAT44(i,j));
  *pmVar2 = in_ESI;
  return;
}

Assistant:

void
DynamicHeap<T, P, C, M>::ascend(unsigned int i)
{
  for (unsigned int j; i && !ordered(j = parent(i), i); i = j)
    swap(i, j);
  index[heap[i].data] = i;
}